

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O3

int Lpk_Resynthesize(Abc_Ntk_t *pNtk,Lpk_Par_t *pPars)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  Lpk_Man_t *p;
  Vec_Vec_t *pVVar9;
  void **ppvVar10;
  Vec_Ptr_t *pVVar11;
  Lpk_Par_t *pLVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int local_6c;
  ProgressBar *local_60;
  ulong local_50;
  timespec ts;
  
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                  ,0x202,"int Lpk_Resynthesize(Abc_Ntk_t *, Lpk_Par_t *)");
  }
  Abc_NtkSweep(pNtk,0);
  pvVar8 = Abc_FrameReadLibLut();
  if (pvVar8 == (void *)0x0) {
    uVar4 = Abc_NtkGetFaninMax(pNtk);
  }
  else {
    pvVar8 = Abc_FrameReadLibLut();
    uVar4 = *(uint *)((long)pvVar8 + 8);
  }
  pPars->nLutSize = uVar4;
  uVar5 = 6;
  if ((6 < (int)uVar4) || (uVar5 = 3, (int)uVar4 < 3)) {
    pPars->nLutSize = uVar5;
    uVar4 = uVar5;
  }
  uVar6 = uVar4 - 2;
  uVar5 = pPars->nVarsShared;
  if ((int)uVar6 < pPars->nVarsShared) {
    pPars->nVarsShared = uVar6;
    uVar5 = uVar6;
  }
  uVar6 = pPars->nLutsMax;
  uVar15 = (ulong)uVar6;
  iVar3 = uVar6 * (uVar4 - 1);
  if (0xf < iVar3) {
    iVar3 = uVar4 + (uVar4 - 1) * (uVar6 - 1) + -1;
    do {
      iVar3 = iVar3 + (1 - uVar4);
      uVar6 = (int)uVar15 - 1;
      uVar15 = (ulong)uVar6;
    } while (0xf < iVar3);
    pPars->nLutsMax = uVar6;
  }
  pPars->nVarsMax = iVar3 + 1;
  if (pPars->fVerbose != 0) {
    printf("Resynthesis for %d %d-LUTs with %d non-MFFC LUTs, %d crossbars, and %d-input cuts.\n",
           uVar15,(ulong)uVar4,(ulong)(uint)pPars->nLutsOver,(ulong)uVar5);
  }
  iVar3 = Abc_NtkToAig(pNtk);
  if (iVar3 == 0) {
    fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
    return 0;
  }
  if (pNtk->ntkFunc != ABC_FUNC_AIG) {
    __assert_fail("Abc_NtkHasAig(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                  ,0x228,"int Lpk_Resynthesize(Abc_Ntk_t *, Lpk_Par_t *)");
  }
  Abc_NtkLevel(pNtk);
  Abc_NtkStartReverseLevels(pNtk,pPars->nGrowthLevel);
  p = Lpk_ManStart(pPars);
  p->pNtk = pNtk;
  local_6c = pNtk->nObjCounts[7];
  p->nNodesTotal = local_6c;
  uVar4 = pNtk->LevelMax;
  pVVar9 = (Vec_Vec_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar4 - 1) {
    uVar5 = uVar4;
  }
  pVVar9->nCap = uVar5;
  if (uVar5 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)(int)uVar5 << 3);
  }
  pVVar9->pArray = ppvVar10;
  if (0 < (int)uVar4) {
    uVar15 = 0;
    do {
      pvVar8 = calloc(1,0x10);
      ppvVar10[uVar15] = pvVar8;
      uVar15 = uVar15 + 1;
    } while (uVar4 != uVar15);
  }
  pVVar9->nSize = uVar4;
  p->vLevels = pVVar9;
  iVar3 = p->pPars->fSatur;
  if (iVar3 != 0) {
    pVVar9 = (Vec_Vec_t *)calloc(1,0x10);
    p->vVisited = pVVar9;
  }
  if (pPars->fVerbose != 0) {
    iVar3 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNets = iVar3;
    p->nTotalNodes = pNtk->nObjCounts[7];
    local_6c = p->nNodesTotal;
    iVar3 = p->pPars->fSatur;
  }
  bVar18 = iVar3 == 0;
  local_50 = 1;
  local_60 = (ProgressBar *)0x0;
  do {
    pVVar11 = pNtk->vObjs;
    if (!bVar18) {
      pVVar9 = p->vVisited;
      iVar7 = pVVar11->nSize;
      iVar3 = iVar7 + 1;
      iVar14 = pVVar9->nSize;
      if (iVar14 <= iVar3) {
        iVar1 = iVar7 + 2;
        if (pVVar9->nCap <= iVar3) {
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((long)iVar1 << 3);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar9->pArray,(long)iVar1 << 3);
            iVar14 = pVVar9->nSize;
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = iVar1;
        }
        if (iVar14 <= iVar3) {
          lVar17 = (long)iVar14;
          iVar3 = (iVar7 - iVar14) + 2;
          do {
            pvVar8 = calloc(1,0x10);
            pVVar9->pArray[lVar17] = pvVar8;
            lVar17 = lVar17 + 1;
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        pVVar9->nSize = iVar1;
        pVVar11 = pNtk->vObjs;
      }
    }
    iVar3 = pVVar11->nSize;
    iVar7 = iVar3;
    if (pPars->fVeryVerbose == 0) {
      local_60 = Extra_ProgressBarStart((FILE *)_stdout,iVar3);
      pVVar11 = pNtk->vObjs;
      iVar7 = pVVar11->nSize;
    }
    if (0 < iVar7) {
      lVar17 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar11->pArray[lVar17];
        if (((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
           ((pPars->fFirst == 0 ||
            (0xfffffffd <
             (*(uint *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray] + 0x14) & 0xf)
             - 5)))) {
          if (iVar3 <= lVar17) break;
          if ((pPars->fVeryVerbose == 0) &&
             ((local_60 == (ProgressBar *)0x0 || (local_60->nItemsNext <= lVar17)))) {
            Extra_ProgressBarUpdate_int(local_60,(int)lVar17,(char *)0x0);
          }
          pLVar12 = p->pPars;
          if (pLVar12->fSatur != 0) {
            iVar7 = Lpk_NodeHasChanged(p,pAVar2->Id);
            if (iVar7 == 0) goto LAB_00470bba;
            pLVar12 = p->pPars;
          }
          p->pObj = pAVar2;
          if (pLVar12->fOldAlgo == 0) {
            Lpk_ResynthesizeNodeNew(p);
          }
          else {
            Lpk_ResynthesizeNode(p);
          }
        }
LAB_00470bba:
        lVar17 = lVar17 + 1;
        pVVar11 = pNtk->vObjs;
      } while (lVar17 < pVVar11->nSize);
    }
    if (pPars->fVeryVerbose == 0) {
      Extra_ProgressBarStop(local_60);
    }
    if (((((double)(local_6c - pNtk->nObjCounts[7]) * 100.0) / (double)p->nNodesTotal < 0.05) ||
        (p->pPars->fSatur == 0)) || (pPars->fFirst != 0)) {
      Abc_NtkStopReverseLevels(pNtk);
      if (pPars->fVerbose != 0) {
        iVar3 = Abc_NtkGetTotalFanins(pNtk);
        p->nTotalNets2 = iVar3;
        iVar3 = pNtk->nObjCounts[7];
        p->nTotalNodes2 = iVar3;
        printf("Node gain = %5d. (%.2f %%)  ",
               ((double)(p->nTotalNodes - iVar3) * 100.0) / (double)p->nTotalNodes);
        printf("Edge gain = %5d. (%.2f %%)  ",
               ((double)(p->nTotalNets - p->nTotalNets2) * 100.0) / (double)p->nTotalNets);
        printf("Muxes = %4d. Dsds = %4d.",(ulong)(uint)p->nMuxes,(ulong)(uint)p->nDsds);
        putchar(10);
        printf("Nodes = %5d (%3d)  Cuts = %5d (%4d)  Changes = %5d  Iter = %2d  Benefit = %d.\n",
               (ulong)(uint)p->nNodesTotal,(ulong)(uint)p->nNodesOver,(ulong)(uint)p->nCutsTotal,
               (ulong)(uint)p->nCutsUseful,(ulong)(uint)p->nChanges,local_50,
               (ulong)(uint)p->nBenefited);
        printf("Non-DSD:");
        iVar3 = pPars->nVarsMax;
        if (2 < iVar3) {
          lVar17 = 0x6d34;
          do {
            if (p->pCuts[0].uSign[lVar17 + -0xb] != 0) {
              printf(" %d=%d",(ulong)((int)lVar17 - 0x6d31));
              iVar3 = pPars->nVarsMax;
            }
            lVar16 = lVar17 + -0x6d31;
            lVar17 = lVar17 + 1;
          } while (lVar16 < iVar3);
        }
        putchar(10);
        iVar7 = 3;
        iVar3 = clock_gettime(3,(timespec *)&ts);
        if (iVar3 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        p->timeTotal = lVar17 + lVar13;
        lVar16 = p->timeEval;
        p->timeEval = lVar16 - p->timeMap;
        p->timeOther = (lVar17 + lVar13) - (lVar16 + p->timeCuts + p->timeTruth);
        Abc_Print(iVar7,"%s =","Cuts  ");
        dVar20 = (double)p->timeCuts;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p->timeTotal != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p->timeTotal;
          dVar21 = dVar20;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar7,"%s =","Truth ");
        dVar20 = (double)p->timeTruth;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p->timeTotal != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p->timeTotal;
          dVar21 = dVar20;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar7,"%s =","CSupps");
        dVar20 = (double)p->timeSupps;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p->timeTotal != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p->timeTotal;
          dVar21 = dVar20;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar7,"%s =","Eval  ");
        dVar20 = (double)p->timeEval;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p->timeTotal != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p->timeTotal;
          dVar21 = dVar20;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar7,"%s ="," MuxAn");
        dVar20 = (double)p->timeEvalMuxAn;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p->timeEval != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p->timeEval;
          dVar21 = dVar20;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar7,"%s ="," MuxSp");
        dVar20 = (double)p->timeEvalMuxSp;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p->timeEval != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p->timeEval;
          dVar21 = dVar20;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar7,"%s ="," DsdAn");
        dVar20 = (double)p->timeEvalDsdAn;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p->timeEval != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p->timeEval;
          dVar21 = dVar20;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar7,"%s ="," DsdSp");
        dVar20 = (double)p->timeEvalDsdSp;
        dVar19 = dVar20 / 1000000.0;
        dVar21 = 0.0;
        if (p->timeEval != 0) {
          dVar20 = (dVar20 * 100.0) / (double)p->timeEval;
          dVar21 = dVar20;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar19,dVar21,dVar20);
        Abc_Print(iVar7,"%s ="," Other");
        lVar13 = p->timeEval;
        dVar19 = (double)(lVar13 - (p->timeEvalMuxSp + p->timeEvalDsdSp +
                                   p->timeEvalMuxAn + p->timeEvalDsdAn));
        dVar21 = 0.0;
        if (lVar13 != 0) {
          dVar21 = (dVar19 * 100.0) / (double)lVar13;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar19 / 1000000.0,dVar21);
        Abc_Print(iVar7,"%s =","Map   ");
        dVar21 = 0.0;
        if (p->timeTotal != 0) {
          dVar21 = ((double)p->timeMap * 100.0) / (double)p->timeTotal;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeMap / 1000000.0,dVar21);
        Abc_Print(iVar7,"%s =","Other ");
        dVar21 = 0.0;
        if (p->timeTotal != 0) {
          dVar21 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar21);
        Abc_Print(iVar7,"%s =","TOTAL ");
        dVar21 = (double)p->timeTotal;
        dVar19 = 0.0;
        if (p->timeTotal != 0) {
          dVar19 = (dVar21 * 100.0) / dVar21;
        }
        Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar21 / 1000000.0,dVar19);
      }
      Lpk_ManStop(p);
      iVar3 = Abc_NtkCheck(pNtk);
      if (iVar3 == 0) {
        puts("Lpk_Resynthesize: The network check has failed.");
        return 0;
      }
      return 1;
    }
    local_50 = (ulong)((int)local_50 + 1);
    bVar18 = false;
    local_6c = pNtk->nObjCounts[7];
  } while( true );
}

Assistant:

int Lpk_Resynthesize( Abc_Ntk_t * pNtk, Lpk_Par_t * pPars )
{
    ProgressBar * pProgress = NULL; // Suppress "might be used uninitialized"
    Lpk_Man_t * p;
    Abc_Obj_t * pObj;
    double Delta;
//    int * pnFanouts, nObjMax;
    int i, Iter, nNodes, nNodesPrev;
    abctime clk = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtk) );
 
    // sweep dangling nodes as a preprocessing step
    Abc_NtkSweep( pNtk, 0 );

    // get the number of inputs
    if ( Abc_FrameReadLibLut() )
        pPars->nLutSize = ((If_LibLut_t *)Abc_FrameReadLibLut())->LutMax;
    else
        pPars->nLutSize = Abc_NtkGetFaninMax( pNtk );
    if ( pPars->nLutSize > 6 )
        pPars->nLutSize = 6;
    if ( pPars->nLutSize < 3 )
        pPars->nLutSize = 3;
    // adjust the number of crossbars based on LUT size
    if ( pPars->nVarsShared > pPars->nLutSize - 2 )
        pPars->nVarsShared = pPars->nLutSize - 2;
    // get the max number of LUTs tried
    pPars->nVarsMax = pPars->nLutsMax * (pPars->nLutSize - 1) + 1; // V = N * (K-1) + 1
    while ( pPars->nVarsMax > 16 )
    {
        pPars->nLutsMax--;
        pPars->nVarsMax = pPars->nLutsMax * (pPars->nLutSize - 1) + 1;

    }
    if ( pPars->fVerbose )
    {
        printf( "Resynthesis for %d %d-LUTs with %d non-MFFC LUTs, %d crossbars, and %d-input cuts.\n",
            pPars->nLutsMax, pPars->nLutSize, pPars->nLutsOver, pPars->nVarsShared, pPars->nVarsMax );
    }
 

    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // set the number of levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // start the manager
    p = Lpk_ManStart( pPars );
    p->pNtk = pNtk;
    p->nNodesTotal = Abc_NtkNodeNum(pNtk);
    p->vLevels = Vec_VecStart( pNtk->LevelMax ); 
    if ( p->pPars->fSatur )
        p->vVisited = Vec_VecStart( 0 );
    if ( pPars->fVerbose )
    {
        p->nTotalNets = Abc_NtkGetTotalFanins(pNtk);
        p->nTotalNodes = Abc_NtkNodeNum(pNtk);
    }
/*
    // save the number of fanouts of all objects
    nObjMax = Abc_NtkObjNumMax( pNtk );
    pnFanouts = ABC_ALLOC( int, nObjMax );
    memset( pnFanouts, 0, sizeof(int) * nObjMax );
    Abc_NtkForEachObj( pNtk, pObj, i )
        pnFanouts[pObj->Id] = Abc_ObjFanoutNum(pObj);
*/

    // iterate over the network
    nNodesPrev = p->nNodesTotal;
    for ( Iter = 1; ; Iter++ )
    {
        // expand storage for changed nodes
        if ( p->pPars->fSatur )
            Vec_VecExpand( p->vVisited, Abc_NtkObjNumMax(pNtk) + 1 );

        // consider all nodes
        nNodes = Abc_NtkObjNumMax(pNtk);
        if ( !pPars->fVeryVerbose )
            pProgress = Extra_ProgressBarStart( stdout, nNodes );
        Abc_NtkForEachNode( pNtk, pObj, i )
        {
            // skip all except the final node
            if ( pPars->fFirst )
            {
                if ( !Abc_ObjIsCo(Abc_ObjFanout0(pObj)) )
                    continue;
            }
            if ( i >= nNodes )
                break;
            if ( !pPars->fVeryVerbose )
                Extra_ProgressBarUpdate( pProgress, i, NULL );
            // skip the nodes that did not change
            if ( p->pPars->fSatur && !Lpk_NodeHasChanged(p, pObj->Id) )
                continue;
            // resynthesize
            p->pObj = pObj;
            if ( p->pPars->fOldAlgo )
                Lpk_ResynthesizeNode( p );
            else
                Lpk_ResynthesizeNodeNew( p );
        }
        if ( !pPars->fVeryVerbose )
            Extra_ProgressBarStop( pProgress );

        // check the increase
        Delta = 100.00 * (nNodesPrev - Abc_NtkNodeNum(pNtk)) / p->nNodesTotal;
        if ( Delta < 0.05 )
            break;
        nNodesPrev = Abc_NtkNodeNum(pNtk);
        if ( !p->pPars->fSatur )
            break;

        if ( pPars->fFirst )
            break;
    }
    Abc_NtkStopReverseLevels( pNtk );
/*
    // report the fanout changes
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( i >= nObjMax )
            continue;
        if ( Abc_ObjFanoutNum(pObj) - pnFanouts[pObj->Id] == 0 )
            continue;
        printf( "%d ", Abc_ObjFanoutNum(pObj) - pnFanouts[pObj->Id] );
    }
    printf( "\n" );
*/

    if ( pPars->fVerbose )
    {
//        Cloud_PrintInfo( p->pDsdMan->dd );
        p->nTotalNets2 = Abc_NtkGetTotalFanins(pNtk);
        p->nTotalNodes2 = Abc_NtkNodeNum(pNtk);
        printf( "Node gain = %5d. (%.2f %%)  ", 
            p->nTotalNodes-p->nTotalNodes2, 100.0*(p->nTotalNodes-p->nTotalNodes2)/p->nTotalNodes );
        printf( "Edge gain = %5d. (%.2f %%)  ", 
            p->nTotalNets-p->nTotalNets2, 100.0*(p->nTotalNets-p->nTotalNets2)/p->nTotalNets );
        printf( "Muxes = %4d. Dsds = %4d.", p->nMuxes, p->nDsds );
        printf( "\n" );
        printf( "Nodes = %5d (%3d)  Cuts = %5d (%4d)  Changes = %5d  Iter = %2d  Benefit = %d.\n", 
            p->nNodesTotal, p->nNodesOver, p->nCutsTotal, p->nCutsUseful, p->nChanges, Iter, p->nBenefited );

        printf( "Non-DSD:" );
        for ( i = 3; i <= pPars->nVarsMax; i++ )
            if ( p->nBlocks[i] )
                printf( " %d=%d", i, p->nBlocks[i] );
        printf( "\n" );

        p->timeTotal = Abc_Clock() - clk;
        p->timeEval  = p->timeEval  - p->timeMap;
        p->timeOther = p->timeTotal - p->timeCuts - p->timeTruth - p->timeEval - p->timeMap;
        ABC_PRTP( "Cuts  ", p->timeCuts,  p->timeTotal );
        ABC_PRTP( "Truth ", p->timeTruth, p->timeTotal );
        ABC_PRTP( "CSupps", p->timeSupps, p->timeTotal );
        ABC_PRTP( "Eval  ", p->timeEval,  p->timeTotal );
        ABC_PRTP( " MuxAn", p->timeEvalMuxAn, p->timeEval );
        ABC_PRTP( " MuxSp", p->timeEvalMuxSp, p->timeEval );
        ABC_PRTP( " DsdAn", p->timeEvalDsdAn, p->timeEval );
        ABC_PRTP( " DsdSp", p->timeEvalDsdSp, p->timeEval );
        ABC_PRTP( " Other", p->timeEval-p->timeEvalMuxAn-p->timeEvalMuxSp-p->timeEvalDsdAn-p->timeEvalDsdSp, p->timeEval );
        ABC_PRTP( "Map   ", p->timeMap,   p->timeTotal );
        ABC_PRTP( "Other ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL ", p->timeTotal, p->timeTotal );
    }

    Lpk_ManStop( p );
    // check the resulting network
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Lpk_Resynthesize: The network check has failed.\n" );
        return 0;
    }
    return 1;
}